

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_inputs_in_struct(CompilerHLSL *this)

{
  uint *puVar1;
  size_t count;
  undefined8 uVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  bool legacy;
  undefined1 local_69 [9];
  ulong local_60;
  undefined8 local_58;
  uint local_50 [8];
  
  local_69[0] = (this->hlsl_options).shader_model < 0x1f;
  uVar6 = 0;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar6 & 0x3f) & 1
        ) != 0) {
      emit_builtin_inputs_in_struct::anon_class_16_2_1de67c4e::operator()
                ((anon_class_16_2_1de67c4e *)local_69,(uint32_t)this);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  count = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_60 = 0;
    local_58 = 8;
    local_69._1_8_ = local_50;
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)(local_69 + 1),count);
    p_Var4 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
             _M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)(local_69 + 1),local_60 + 1);
        *(uint *)(local_69._1_8_ + local_60 * 4) = *(uint *)&p_Var4[1]._M_nxt;
        local_60 = local_60 + 1;
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    uVar2 = local_69._1_8_;
    if (local_60 != 0) {
      puVar1 = (uint *)(local_69._1_8_ + local_60 * 4);
      lVar3 = 0x3f;
      if (local_60 != 0) {
        for (; local_60 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_69._1_8_,puVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(uVar2,puVar1);
      if (local_60 != 0) {
        lVar5 = local_60 << 2;
        lVar3 = 0;
        do {
          emit_builtin_inputs_in_struct::anon_class_16_2_1de67c4e::operator()
                    ((anon_class_16_2_1de67c4e *)local_69,(uint32_t)this);
          lVar3 = lVar3 + 4;
        } while (lVar5 != lVar3);
      }
    }
    local_60 = 0;
    if ((uint *)local_69._1_8_ != local_50) {
      free((void *)local_69._1_8_);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_inputs_in_struct()
{
	bool legacy = hlsl_options.shader_model <= 30;
	active_input_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInFragCoord:
			type = "float4";
			semantic = legacy ? "VPOS" : "SV_Position";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
			if (legacy)
				SPIRV_CROSS_THROW("Vertex index not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_VertexID";
			break;

		case BuiltInPrimitiveId:
			type = "uint";
			semantic = "SV_PrimitiveID";
			break;

		case BuiltInInstanceId:
		case BuiltInInstanceIndex:
			if (legacy)
				SPIRV_CROSS_THROW("Instance index not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_InstanceID";
			break;

		case BuiltInSampleId:
			if (legacy)
				SPIRV_CROSS_THROW("Sample ID not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_SampleIndex";
			break;

		case BuiltInSampleMask:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Sample Mask input is only supported in PS 5.0 or higher.");
			type = "uint";
			semantic = "SV_Coverage";
			break;

		case BuiltInGlobalInvocationId:
			type = "uint3";
			semantic = "SV_DispatchThreadID";
			break;

		case BuiltInLocalInvocationId:
			type = "uint3";
			semantic = "SV_GroupThreadID";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			semantic = "SV_GroupIndex";
			break;

		case BuiltInWorkgroupId:
			type = "uint3";
			semantic = "SV_GroupID";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			semantic = "SV_IsFrontFace";
			break;

		case BuiltInViewIndex:
			if (hlsl_options.shader_model < 61 || (get_entry_point().model != ExecutionModelVertex && get_entry_point().model != ExecutionModelFragment))
				SPIRV_CROSS_THROW("View Index input is only supported in VS and PS 6.1 or higher.");
			type = "uint";
			semantic = "SV_ViewID";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			// Handled specially.
			break;

		case BuiltInBaseVertex:
			if (hlsl_options.shader_model >= 68)
			{
				type = "uint";
				semantic = "SV_StartVertexLocation";
			}
			break;

		case BuiltInBaseInstance:
			if (hlsl_options.shader_model >= 68)
			{
				type = "uint";
				semantic = "SV_StartInstanceLocation";
			}
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Helper Invocation input is only supported in PS 5.0 or higher.");
			break;

		case BuiltInClipDistance:
			// HLSL is a bit weird here, use SV_ClipDistance0, SV_ClipDistance1 and so on with vectors.
			for (uint32_t clip = 0; clip < clip_distance_count; clip += 4)
			{
				uint32_t to_declare = clip_distance_count - clip;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = clip / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassInput), semantic_index,
				          " : SV_ClipDistance", semantic_index, ";");
			}
			break;

		case BuiltInCullDistance:
			// HLSL is a bit weird here, use SV_CullDistance0, SV_CullDistance1 and so on with vectors.
			for (uint32_t cull = 0; cull < cull_distance_count; cull += 4)
			{
				uint32_t to_declare = cull_distance_count - cull;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = cull / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassInput), semantic_index,
				          " : SV_CullDistance", semantic_index, ";");
			}
			break;

		case BuiltInPointCoord:
			// PointCoord is not supported, but provide a way to just ignore that, similar to PointSize.
			if (hlsl_options.point_coord_compat)
				break;
			else
				SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");

		case BuiltInLayer:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Render target array index input is only supported in PS 5.0 or higher.");
			type = "uint";
			semantic = "SV_RenderTargetArrayIndex";
			break;

		default:
			SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassInput), " : ", semantic, ";");
	});
}